

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O1

future<dap::ResponseOrError<dap::LaunchResponse>_> __thiscall
dap::Session::send<dap::LaunchRequest,void>(Session *this,LaunchRequest *request)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Session SVar2;
  _Alloc_hider _Var3;
  char cVar4;
  TypeInfo *pTVar5;
  TypeInfo *pTVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  future<dap::ResponseOrError<dap::LaunchResponse>_> fVar8;
  promise<dap::ResponseOrError<dap::LaunchResponse>_> promise;
  Session local_a8;
  _Alloc_hider local_a0;
  undefined8 *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_90;
  code *local_88;
  code *apcStack_80 [3];
  element_type *local_68;
  Error local_60;
  unique_lock<std::mutex> local_40;
  
  local_a8._vptr_Session = (_func_int **)0x0;
  local_68 = (element_type *)this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>>,std::allocator<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0,
             (promise_state<dap::ResponseOrError<dap::LaunchResponse>_> **)&local_a8,
             (allocator<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>_> *)
             &local_98);
  pTVar5 = TypeOf<dap::LaunchRequest>::type();
  pTVar6 = TypeOf<dap::LaunchResponse>::type();
  _Var3._M_p = local_a0._M_p;
  SVar2._vptr_Session = local_a8._vptr_Session;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_a0._M_p + 8) = *(int *)(local_a0._M_p + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_a0._M_p + 8) = *(int *)(local_a0._M_p + 8) + 1;
    }
  }
  local_88 = (code *)0x0;
  apcStack_80[0] = (code *)0x0;
  local_98 = (undefined8 *)0x0;
  paStack_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
  local_98 = (undefined8 *)operator_new(0x10);
  *local_98 = SVar2._vptr_Session;
  local_98[1] = _Var3._M_p;
  apcStack_80[0] =
       std::
       _Function_handler<void_(const_void_*,_const_dap::Error_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:422:20)>
       ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(const_void_*,_const_dap::Error_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:422:20)>
             ::_M_manager;
  cVar4 = (**(code **)((long)(request->restart).val.value.value + 0x50))(request,pTVar5,pTVar6);
  _Var7._M_pi = extraout_RDX;
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
    _Var7._M_pi = extraout_RDX_00;
  }
  if (cVar4 == '\0') {
    Error::Error(&local_60,"Failed to send request");
    paVar1 = &local_60.message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.message._M_dataplus._M_p == paVar1) {
      apcStack_80[1] = (code *)local_60.message.field_2._8_8_;
      paStack_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)apcStack_80;
    }
    else {
      paStack_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_60.message._M_dataplus._M_p;
    }
    apcStack_80[0] =
         (code *)CONCAT71(local_60.message.field_2._M_allocated_capacity._1_7_,
                          local_60.message.field_2._M_local_buf[0]);
    local_88 = (code *)local_60.message._M_string_length;
    local_60.message._M_string_length = 0;
    local_60.message.field_2._M_local_buf[0] = '\0';
    local_40._M_device = (mutex_type *)(local_a8._vptr_Session + 5);
    local_40._M_owns = false;
    local_60.message._M_dataplus._M_p = (pointer)paVar1;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    std::__cxx11::string::operator=((string *)(local_a8._vptr_Session + 1),(string *)&paStack_90);
    *(undefined1 *)(local_a8._vptr_Session + 0x10) = 1;
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    _Var7._M_pi = extraout_RDX_01;
    if (paStack_90 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)apcStack_80) {
      operator_delete(paStack_90,(ulong)((long)apcStack_80[0] + 1));
      _Var7._M_pi = extraout_RDX_02;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.message._M_dataplus._M_p != paVar1) {
      operator_delete(local_60.message._M_dataplus._M_p,
                      CONCAT71(local_60.message.field_2._M_allocated_capacity._1_7_,
                               local_60.message.field_2._M_local_buf[0]) + 1);
      _Var7._M_pi = extraout_RDX_03;
    }
  }
  *(_func_int ***)&local_68->val = local_a8._vptr_Session;
  (local_68->val).error.message._M_dataplus._M_p = local_a0._M_p;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_a0._M_p + 8) = *(int *)(local_a0._M_p + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_a0._M_p + 8) = *(int *)(local_a0._M_p + 8) + 1;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_p);
    _Var7._M_pi = extraout_RDX_04;
  }
  fVar8.state.
  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var7._M_pi;
  fVar8.state.
  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_68;
  return (future<dap::ResponseOrError<dap::LaunchResponse>_>)
         fVar8.state.
         super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

future<ResponseOrError<typename T::Response>> Session::send(const T& request) {
  using Response = typename T::Response;
  promise<ResponseOrError<Response>> promise;
  auto sent = send(TypeOf<T>::type(), TypeOf<Response>::type(), &request,
                   [=](const void* result, const Error* error) {
                     if (error != nullptr) {
                       promise.set_value(ResponseOrError<Response>(*error));
                     } else {
                       promise.set_value(ResponseOrError<Response>(
                           *reinterpret_cast<const Response*>(result)));
                     }
                   });
  if (!sent) {
    promise.set_value(Error("Failed to send request"));
  }
  return promise.get_future();
}